

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_modeling.cc
# Opt level: O0

bool sptk::GaussianMixtureModeling::CalculateLogProbability
               (int num_order,int num_mixture,bool is_diagonal,bool check_size,
               vector<double,_std::allocator<double>_> *input_vector,
               vector<double,_std::allocator<double>_> *weights,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *mean_vectors,
               vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
               *covariance_matrices,
               vector<double,_std::allocator<double>_> *components_of_log_probability,
               double *log_probability,Buffer *buffer)

{
  bool bVar1;
  size_type sVar2;
  double *pdVar3;
  reference pvVar4;
  const_reference this;
  const_reference pvVar5;
  byte in_CL;
  byte in_DL;
  int in_ESI;
  int in_EDI;
  vector<double,_std::allocator<double>_> *in_R8;
  vector<double,_std::allocator<double>_> *in_R9;
  double dVar6;
  double dVar7;
  vector<double,_std::allocator<double>_> *pvVar8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_00000008;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *in_stack_00000010;
  vector<double,_std::allocator<double>_> *in_stack_00000018;
  double *in_stack_00000020;
  long in_stack_00000028;
  double p;
  int m;
  double tmp_1;
  int l_3;
  int l_2;
  double *d;
  double diff;
  int l_1;
  double *mu;
  double sum;
  int k_2;
  double total;
  double *x;
  int k_1;
  vector<double,_std::allocator<double>_> diag;
  SymmetricMatrix tmp;
  int l;
  double log_determinant;
  double gconst;
  int k;
  int length;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe08;
  SymmetricMatrix *in_stack_fffffffffffffe10;
  SymmetricMatrix *in_stack_fffffffffffffe18;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe20;
  size_type in_stack_fffffffffffffe28;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe30;
  double *in_stack_fffffffffffffe38;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe48;
  SymmetricMatrix *in_stack_fffffffffffffe50;
  SymmetricMatrix *in_stack_fffffffffffffe58;
  undefined1 local_168 [80];
  double local_118;
  int local_10c;
  const_reference local_108;
  value_type local_100;
  int local_f4;
  double local_f0;
  const_reference local_e8;
  int local_e0;
  double *local_d8;
  iterator in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  uint uVar9;
  SymmetricMatrix local_c0;
  Row local_58;
  int local_3c;
  double local_38;
  vector<double,_std::allocator<double>_> *local_30;
  int local_28;
  int local_24;
  vector<double,_std::allocator<double>_> *local_20;
  vector<double,_std::allocator<double>_> *local_18;
  byte local_e;
  byte local_d;
  int local_c;
  int local_8;
  byte local_1;
  
  local_d = in_DL & 1;
  local_e = in_CL & 1;
  local_24 = in_EDI + 1;
  if (((in_ESI < 0) ||
      (local_20 = in_R9, local_18 = in_R8, local_c = in_ESI, local_8 = in_EDI,
      sVar2 = std::vector<double,_std::allocator<double>_>::size(in_R8), sVar2 != (long)local_24))
     || (in_stack_00000028 == 0)) {
    local_1 = 0;
  }
  else if (((local_e & 1) == 0) ||
          (bVar1 = anon_unknown.dwarf_1a1ff::CheckGmm
                             ((int)in_stack_fffffffffffffe30,
                              (int)(in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20,
                              (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)in_stack_fffffffffffffe18,
                              (vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                               *)in_stack_fffffffffffffe10), bVar1)) {
    if ((in_stack_00000018 != (vector<double,_std::allocator<double>_> *)0x0) &&
       (sVar2 = std::vector<double,_std::allocator<double>_>::size(in_stack_00000018),
       sVar2 != (long)local_c)) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    }
    sVar2 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_stack_00000028 + 8));
    if (sVar2 != (long)local_24) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    }
    sVar2 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_stack_00000028 + 0x20));
    if (sVar2 != (long)local_c) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    }
    sVar2 = std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::size
                      ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                       (in_stack_00000028 + 0x38));
    if (sVar2 != (long)local_c) {
      std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::resize
                ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                 in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    }
    if ((*(byte *)(in_stack_00000028 + 0x50) & 1) == 0) {
      for (local_28 = 0; local_28 < local_c; local_28 = local_28 + 1) {
        dVar6 = (double)local_24;
        dVar7 = log(6.283185307179586);
        local_30 = (vector<double,_std::allocator<double>_> *)(dVar6 * dVar7);
        local_38 = 0.0;
        if ((local_d & 1) == 0) {
          SymmetricMatrix::SymmetricMatrix
                    (in_stack_fffffffffffffe50,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20));
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)0x112001);
          std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                    (in_stack_00000010,(long)local_28);
          bVar1 = SymmetricMatrix::CholeskyDecomposition
                            (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                             in_stack_fffffffffffffe48);
          if (bVar1) {
            in_stack_fffffffffffffe50 = &local_c0;
            in_stack_ffffffffffffff30 =
                 std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe08);
            local_d8 = (double *)
                       std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe08);
            in_stack_fffffffffffffe58 =
                 (SymmetricMatrix *)
                 std::
                 accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,sptk::GaussianMixtureModeling::CalculateLogProbability(int,int,bool,bool,std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>const&,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>const&,std::vector<sptk::SymmetricMatrix,std::allocator<sptk::SymmetricMatrix>>const&,std::vector<double,std::allocator<double>>*,double*,sptk::GaussianMixtureModeling::Buffer*)::__0>
                           (in_stack_ffffffffffffff30._M_current,local_d8);
            local_38 = (double)in_stack_fffffffffffffe58 + local_38;
            local_30 = (vector<double,_std::allocator<double>_> *)(local_38 + (double)local_30);
          }
          else {
            local_1 = 0;
          }
          uVar9 = (uint)!bVar1;
          std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffe20);
          SymmetricMatrix::~SymmetricMatrix(in_stack_fffffffffffffe10);
          if (uVar9 != 0) goto LAB_001126b5;
          in_stack_ffffffffffffff3c = 0;
        }
        else {
          for (local_3c = 0; local_3c <= local_8; local_3c = local_3c + 1) {
            std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                      (in_stack_00000010,(long)local_28);
            SymmetricMatrix::operator[]
                      (in_stack_fffffffffffffe18,(int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
            pdVar3 = SymmetricMatrix::Row::operator[]
                               ((Row *)in_stack_fffffffffffffe10,
                                (int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
            dVar6 = log(*pdVar3);
            local_38 = dVar6 + local_38;
            SymmetricMatrix::Row::~Row(&local_58);
          }
          local_30 = (vector<double,_std::allocator<double>_> *)(local_38 + (double)local_30);
        }
        in_stack_fffffffffffffe48 = local_30;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_stack_00000028 + 0x20),
                            (long)local_28);
        *pvVar4 = (value_type)in_stack_fffffffffffffe48;
      }
      if ((local_d & 1) == 0) {
        for (local_e0 = 0; local_e0 < local_c; local_e0 = local_e0 + 1) {
          std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                    (in_stack_00000010,(long)local_e0);
          std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                    ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                     (in_stack_00000028 + 0x38),(long)local_e0);
          bVar1 = SymmetricMatrix::Invert
                            ((SymmetricMatrix *)
                             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                             (SymmetricMatrix *)in_stack_ffffffffffffff30._M_current);
          if (!bVar1) {
            local_1 = 0;
            goto LAB_001126b5;
          }
        }
      }
      *(undefined1 *)(in_stack_00000028 + 0x50) = 1;
    }
    local_e8 = std::vector<double,_std::allocator<double>_>::operator[](local_18,0);
    local_f0 = -10000000000.0;
    for (local_f4 = 0; local_f4 < local_c; local_f4 = local_f4 + 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_stack_00000028 + 0x20),
                          (long)local_f4);
      local_100 = *pvVar4;
      this = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](in_stack_00000008,(long)local_f4);
      local_108 = std::vector<double,_std::allocator<double>_>::operator[](this,0);
      if ((local_d & 1) == 0) {
        local_168._48_8_ =
             std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_stack_00000028 + 8),0);
        for (local_168._44_4_ = 0; (int)local_168._44_4_ <= local_8;
            local_168._44_4_ = local_168._44_4_ + 1) {
          *(double **)(local_168._48_8_ + (long)(int)local_168._44_4_ * 8) =
               (double *)(local_e8[(int)local_168._44_4_] - local_108[(int)local_168._44_4_]);
        }
        for (local_168._40_4_ = 0; (int)local_168._40_4_ <= local_8;
            local_168._40_4_ = local_168._40_4_ + 1) {
          local_168._32_8_ = (pointer)0x0;
          for (local_168._28_4_ = 0; (int)local_168._28_4_ <= local_8;
              local_168._28_4_ = local_168._28_4_ + 1) {
            in_stack_fffffffffffffe10 =
                 *(SymmetricMatrix **)(local_168._48_8_ + (long)(int)local_168._28_4_ * 8);
            std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                      ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                       (in_stack_00000028 + 0x38),(long)local_f4);
            in_stack_fffffffffffffe18 = (SymmetricMatrix *)local_168;
            SymmetricMatrix::operator[]
                      (in_stack_fffffffffffffe18,(int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
            pdVar3 = SymmetricMatrix::Row::operator[]
                               ((Row *)in_stack_fffffffffffffe10,
                                (int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
            local_168._32_8_ =
                 (double)in_stack_fffffffffffffe10 * *pdVar3 + (double)local_168._32_8_;
            SymmetricMatrix::Row::~Row((Row *)local_168);
          }
          local_100 = (double)local_168._32_8_ *
                      (double)*(pointer)(local_168._48_8_ + (long)(int)local_168._40_4_ * 8) +
                      local_100;
        }
      }
      else {
        for (local_10c = 0; local_10c <= local_8; local_10c = local_10c + 1) {
          local_118 = local_e8[local_10c] - local_108[local_10c];
          dVar6 = local_118 * local_118;
          std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                    (in_stack_00000010,(long)local_f4);
          in_stack_fffffffffffffe30 = (vector<double,_std::allocator<double>_> *)(local_168 + 0x38);
          SymmetricMatrix::operator[]
                    (in_stack_fffffffffffffe18,(int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
          in_stack_fffffffffffffe38 =
               SymmetricMatrix::Row::operator[]
                         ((Row *)in_stack_fffffffffffffe10,
                          (int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
          local_100 = dVar6 / *in_stack_fffffffffffffe38 + local_100;
          SymmetricMatrix::Row::~Row((Row *)(local_168 + 0x38));
        }
      }
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_f4);
      dVar6 = log(*pvVar5);
      pvVar8 = (vector<double,_std::allocator<double>_> *)(local_100 * -0.5 + dVar6);
      if (in_stack_00000018 != (vector<double,_std::allocator<double>_> *)0x0) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_stack_00000018,(long)local_f4);
        *pvVar4 = (value_type)pvVar8;
        in_stack_fffffffffffffe08 = pvVar8;
      }
      local_f0 = AddInLogSpace((double)in_stack_fffffffffffffe38,(double)in_stack_fffffffffffffe30);
    }
    if (in_stack_00000020 != (double *)0x0) {
      *in_stack_00000020 = local_f0;
    }
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
LAB_001126b5:
  return (bool)(local_1 & 1);
}

Assistant:

bool GaussianMixtureModeling::CalculateLogProbability(
    int num_order, int num_mixture, bool is_diagonal, bool check_size,
    const std::vector<double>& input_vector, const std::vector<double>& weights,
    const std::vector<std::vector<double> >& mean_vectors,
    const std::vector<SymmetricMatrix>& covariance_matrices,
    std::vector<double>* components_of_log_probability, double* log_probability,
    GaussianMixtureModeling::Buffer* buffer) {
  // Check inputs.
  const int length(num_order + 1);
  if (num_mixture < 0 ||
      input_vector.size() != static_cast<std::size_t>(length) ||
      NULL == buffer) {
    return false;
  }

  // Check size of GMM.
  if (check_size && !CheckGmm(num_mixture, length, weights, mean_vectors,
                              covariance_matrices)) {
    return false;
  }

  // Prepare memories.
  if (components_of_log_probability &&
      components_of_log_probability->size() !=
          static_cast<std::size_t>(num_mixture)) {
    components_of_log_probability->resize(num_mixture);
  }
  if (buffer->d_.size() != static_cast<std::size_t>(length)) {
    buffer->d_.resize(length);
  }
  if (buffer->gconsts_.size() != static_cast<std::size_t>(num_mixture)) {
    buffer->gconsts_.resize(num_mixture);
  }
  if (buffer->precisions_.size() != static_cast<std::size_t>(num_mixture)) {
    buffer->precisions_.resize(num_mixture);
  }

  if (!buffer->precomputed_) {
    // Precompute constant of log likelihood without multiplying -0.5.
    for (int k(0); k < num_mixture; ++k) {
      double gconst(length * std::log(sptk::kTwoPi));
      double log_determinant(0.0);
      if (is_diagonal) {
        for (int l(0); l <= num_order; ++l) {
          log_determinant += std::log(covariance_matrices[k][l][l]);
        }
        gconst += log_determinant;
      } else {
        SymmetricMatrix tmp;
        std::vector<double> diag;
        if (!covariance_matrices[k].CholeskyDecomposition(&tmp, &diag)) {
          return false;
        }
        log_determinant += std::accumulate(
            diag.begin(), diag.end(), 0.0,
            [](double acc, double x) { return acc + std::log(x); });
        gconst += log_determinant;
      }
      buffer->gconsts_[k] = gconst;
    }

    // Precompute inverse of covariance matrix.
    if (!is_diagonal) {
      for (int k(0); k < num_mixture; ++k) {
        if (!covariance_matrices[k].Invert(&(buffer->precisions_[k]))) {
          return false;
        }
      }
    }

    buffer->precomputed_ = true;
  }

  const double* x(&(input_vector[0]));
  double total(sptk::kLogZero);

  // Compute log probability of data.
  for (int k(0); k < num_mixture; ++k) {
    double sum(buffer->gconsts_[k]);
    const double* mu(&(mean_vectors[k][0]));
    if (is_diagonal) {
      for (int l(0); l <= num_order; ++l) {
        const double diff(x[l] - mu[l]);
        sum += diff * diff / covariance_matrices[k][l][l];
      }
    } else {
      double* d(&(buffer->d_[0]));
      for (int l(0); l <= num_order; ++l) {
        d[l] = x[l] - mu[l];
      }
      for (int l(0); l <= num_order; ++l) {
        double tmp(0.0);
        for (int m(0); m <= num_order; ++m) {
          tmp += d[m] * buffer->precisions_[k][l][m];
        }
        sum += tmp * d[l];
      }
    }

    const double p(std::log(weights[k]) - 0.5 * sum);
    if (components_of_log_probability) {
      (*components_of_log_probability)[k] = p;
    }
    total = AddInLogSpace(total, p);
  }

  if (log_probability) {
    *log_probability = total;
  }

  return true;
}